

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLenum gl4cts::EnhancedLayouts::Utils::Buffer::GetBufferGLenum(BUFFERS buffer)

{
  TestError *this;
  GLenum local_10;
  GLenum result;
  BUFFERS buffer_local;
  
  switch(buffer) {
  case Array:
    local_10 = 0x8892;
    break;
  case Element:
    local_10 = 0x8893;
    break;
  case Shader_Storage:
    local_10 = 0x90d2;
    break;
  case Texture:
    local_10 = 0x8c2a;
    break;
  case Transform_feedback:
    local_10 = 0x8c8e;
    break;
  case Uniform:
    local_10 = 0x8a11;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
               ,0x7a9);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

GLenum Buffer::GetBufferGLenum(BUFFERS buffer)
{
	GLenum result = 0;

	switch (buffer)
	{
	case Array:
		result = GL_ARRAY_BUFFER;
		break;
	case Element:
		result = GL_ELEMENT_ARRAY_BUFFER;
		break;
	case Shader_Storage:
		result = GL_SHADER_STORAGE_BUFFER;
		break;
	case Texture:
		result = GL_TEXTURE_BUFFER;
		break;
	case Transform_feedback:
		result = GL_TRANSFORM_FEEDBACK_BUFFER;
		break;
	case Uniform:
		result = GL_UNIFORM_BUFFER;
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}